

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_bool32 ma_dr_flac__init_private__native
                    (ma_dr_flac_init_info *pInit,ma_dr_flac_read_proc onRead,
                    ma_dr_flac_seek_proc onSeek,ma_dr_flac_meta_proc onMeta,void *pUserData,
                    void *pUserDataMD,ma_bool32 relaxed)

{
  ma_uint8 mVar1;
  ma_bool32 mVar2;
  size_t sVar3;
  ma_dr_flac_seek_origin extraout_EDX;
  ma_dr_flac_streaminfo streaminfo;
  ma_dr_flac_metadata metadata;
  
  pInit->container = ma_dr_flac_container_native;
  sVar3 = (*onRead)(onMeta,&metadata,4);
  if (sVar3 == 4) {
    if ((metadata.type >> 0x18 | (metadata.type & 0xff0000) >> 8 | (metadata.type & 0xff00) << 8 |
        metadata.type << 0x18 & 0x7fffffff) == 0x22) {
      mVar2 = ma_dr_flac__read_streaminfo(onRead,onMeta,&streaminfo);
      if (mVar2 != 0) {
        pInit->hasStreamInfoBlock = 1;
        pInit->sampleRate = streaminfo.sampleRate;
        pInit->channels = streaminfo.channels;
        pInit->bitsPerSample = streaminfo.bitsPerSample;
        pInit->totalPCMFrameCount = streaminfo.totalPCMFrameCount;
        pInit->maxBlockSizeInPCMFrames = streaminfo.maxBlockSizeInPCMFrames;
        pInit->hasMetadataBlocks = ~(metadata.type << 0x18) >> 0x1f;
        if (onSeek == (ma_dr_flac_seek_proc)0x0) {
          return 1;
        }
        metadata.type = 0;
        metadata.pRawData = (void *)0x0;
        metadata.rawDataSize = 0;
        metadata.data.streaminfo.totalPCMFrameCount = streaminfo.totalPCMFrameCount;
        metadata.data._32_1_ = streaminfo.md5[0];
        metadata.data._33_1_ = streaminfo.md5[1];
        metadata.data._34_1_ = streaminfo.md5[2];
        metadata.data._35_1_ = streaminfo.md5[3];
        metadata.data._36_1_ = streaminfo.md5[4];
        metadata.data._37_1_ = streaminfo.md5[5];
        metadata.data._38_1_ = streaminfo.md5[6];
        metadata.data._39_1_ = streaminfo.md5[7];
        metadata.data._40_1_ = streaminfo.md5[8];
        metadata.data._41_1_ = streaminfo.md5[9];
        metadata.data._42_1_ = streaminfo.md5[10];
        metadata.data._43_1_ = streaminfo.md5[0xb];
        metadata.data._44_1_ = streaminfo.md5[0xc];
        metadata.data._45_1_ = streaminfo.md5[0xd];
        metadata.data._46_1_ = streaminfo.md5[0xe];
        metadata.data._47_1_ = streaminfo.md5[0xf];
        (*onSeek)(pUserData,(int)&metadata,extraout_EDX);
        return 1;
      }
    }
    else if ((int)pUserDataMD != 0) {
      pInit->hasStreamInfoBlock = 0;
      pInit->hasMetadataBlocks = 0;
      mVar2 = ma_dr_flac__read_next_flac_frame_header(&pInit->bs,'\0',&pInit->firstFrameHeader);
      if (mVar2 == 0) {
        return 0;
      }
      mVar1 = (pInit->firstFrameHeader).bitsPerSample;
      if (mVar1 == '\0') {
        return 0;
      }
      pInit->sampleRate = (pInit->firstFrameHeader).sampleRate;
      pInit->channels = (&DAT_00191e00)[(char)(pInit->firstFrameHeader).channelAssignment];
      pInit->bitsPerSample = mVar1;
      pInit->maxBlockSizeInPCMFrames = 0xffff;
      return 1;
    }
  }
  return 0;
}

Assistant:

static ma_bool32 ma_dr_flac__init_private__native(ma_dr_flac_init_info* pInit, ma_dr_flac_read_proc onRead, ma_dr_flac_seek_proc onSeek, ma_dr_flac_meta_proc onMeta, void* pUserData, void* pUserDataMD, ma_bool32 relaxed)
{
    ma_uint8 isLastBlock;
    ma_uint8 blockType;
    ma_uint32 blockSize;
    (void)onSeek;
    pInit->container = ma_dr_flac_container_native;
    if (!ma_dr_flac__read_and_decode_block_header(onRead, pUserData, &isLastBlock, &blockType, &blockSize)) {
        return MA_FALSE;
    }
    if (blockType != MA_DR_FLAC_METADATA_BLOCK_TYPE_STREAMINFO || blockSize != 34) {
        if (!relaxed) {
            return MA_FALSE;
        } else {
            pInit->hasStreamInfoBlock = MA_FALSE;
            pInit->hasMetadataBlocks  = MA_FALSE;
            if (!ma_dr_flac__read_next_flac_frame_header(&pInit->bs, 0, &pInit->firstFrameHeader)) {
                return MA_FALSE;
            }
            if (pInit->firstFrameHeader.bitsPerSample == 0) {
                return MA_FALSE;
            }
            pInit->sampleRate              = pInit->firstFrameHeader.sampleRate;
            pInit->channels                = ma_dr_flac__get_channel_count_from_channel_assignment(pInit->firstFrameHeader.channelAssignment);
            pInit->bitsPerSample           = pInit->firstFrameHeader.bitsPerSample;
            pInit->maxBlockSizeInPCMFrames = 65535;
            return MA_TRUE;
        }
    } else {
        ma_dr_flac_streaminfo streaminfo;
        if (!ma_dr_flac__read_streaminfo(onRead, pUserData, &streaminfo)) {
            return MA_FALSE;
        }
        pInit->hasStreamInfoBlock      = MA_TRUE;
        pInit->sampleRate              = streaminfo.sampleRate;
        pInit->channels                = streaminfo.channels;
        pInit->bitsPerSample           = streaminfo.bitsPerSample;
        pInit->totalPCMFrameCount      = streaminfo.totalPCMFrameCount;
        pInit->maxBlockSizeInPCMFrames = streaminfo.maxBlockSizeInPCMFrames;
        pInit->hasMetadataBlocks       = !isLastBlock;
        if (onMeta) {
            ma_dr_flac_metadata metadata;
            metadata.type = MA_DR_FLAC_METADATA_BLOCK_TYPE_STREAMINFO;
            metadata.pRawData = NULL;
            metadata.rawDataSize = 0;
            metadata.data.streaminfo = streaminfo;
            onMeta(pUserDataMD, &metadata);
        }
        return MA_TRUE;
    }
}